

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void uv__custom_sem_wait(uv_sem_t *sem_)

{
  uv_mutex_t *mutex;
  uv_semaphore_t *sem;
  uv_sem_t *sem__local;
  
  mutex = *(uv_mutex_t **)sem_;
  uv_mutex_lock(mutex);
  while (*(int *)((long)mutex + 0x58) == 0) {
    uv_cond_wait((uv_cond_t *)(mutex + 1),mutex);
  }
  *(int *)((long)mutex + 0x58) = *(int *)((long)mutex + 0x58) + -1;
  uv_mutex_unlock(mutex);
  return;
}

Assistant:

static void uv__custom_sem_wait(uv_sem_t* sem_) {
  uv_semaphore_t* sem;

  sem = *(uv_semaphore_t**)sem_;
  uv_mutex_lock(&sem->mutex);
  while (sem->value == 0)
    uv_cond_wait(&sem->cond, &sem->mutex);
  sem->value--;
  uv_mutex_unlock(&sem->mutex);
}